

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

bool __thiscall
density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
try_reentrant_pop(heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                  *this)

{
  bool bVar1;
  undefined1 local_28 [8];
  reentrant_consume_operation operation;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *this_local;
  
  operation.m_control = (ControlBlock *)this;
  try_start_reentrant_consume
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_28);
  bVar1 = density::heter_queue::reentrant_consume_operation::operator_cast_to_bool
                    ((reentrant_consume_operation *)local_28);
  if (bVar1) {
    reentrant_consume_operation::commit((reentrant_consume_operation *)local_28);
    this_local._7_1_ = 1;
  }
  reentrant_consume_operation::~reentrant_consume_operation((reentrant_consume_operation *)local_28)
  ;
  if (!bVar1) {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool try_reentrant_pop() noexcept
        {
            if (auto operation = try_start_reentrant_consume())
            {
                operation.commit();
                return true;
            }
            return false;
        }